

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_print(lua_State *L)

{
  byte local_145;
  uint local_144;
  ulong uStack_140;
  MSize len;
  size_t size;
  char *str;
  cTValue *o;
  cTValue *pcStack_120;
  int shortcut;
  cTValue *tv;
  ptrdiff_t nargs;
  ptrdiff_t i;
  lua_State *L_local;
  uint64_t *local_f8;
  ptrdiff_t local_f0;
  char *local_e8;
  undefined8 *local_e0;
  ptrdiff_t local_d8;
  cTValue *local_d0;
  cTValue *local_c8;
  ptrdiff_t local_c0;
  char *local_b8;
  cTValue *local_b0;
  ptrdiff_t local_a8;
  char *local_a0;
  undefined8 *local_98;
  ptrdiff_t local_90;
  char *local_88;
  uint64_t *local_80;
  ptrdiff_t local_78;
  ulong local_70;
  ulong *local_68;
  ptrdiff_t local_60;
  undefined4 local_54;
  ulong local_50;
  ulong *local_48;
  ptrdiff_t local_40;
  char *local_38;
  ulong *local_30;
  ptrdiff_t local_28;
  undefined4 local_1c;
  ulong local_18;
  ulong *local_10;
  
  tv = (cTValue *)((long)L->top - (long)L->base >> 3);
  i = (ptrdiff_t)L;
  pcStack_120 = lj_tab_getstr((GCtab *)(L->env).gcptr64,
                              (GCstr *)(*(ulong *)((L->base[-2].u64 & 0x7fffffffffff) + 0x30) &
                                       0x7fffffffffff));
  if ((pcStack_120 == (cTValue *)0x0) || (pcStack_120->u64 == 0xffffffffffffffff)) {
    local_68 = *(ulong **)(i + 0x28);
    *(ulong **)(i + 0x28) = local_68 + 1;
    local_70 = *(ulong *)((*(ulong *)(*(long *)(i + 0x20) + -0x10) & 0x7fffffffffff) + 0x30) &
               0x7fffffffffff;
    local_60 = i;
    local_40 = i;
    local_54 = 0xfffffffb;
    local_1c = 0xfffffffb;
    *local_68 = local_70 | 0xfffd800000000000;
    local_28 = i;
    local_38 = "store to dead GC object";
    local_50 = local_70;
    local_48 = local_68;
    local_30 = local_68;
    local_18 = local_70;
    local_10 = local_68;
    lua_gettable((lua_State *)i,-0x2712);
    pcStack_120 = (cTValue *)(*(long *)(i + 0x28) + -8);
  }
  else {
    local_c8 = *(cTValue **)(i + 0x28);
    *(cTValue **)(i + 0x28) = local_c8 + 1;
    local_c0 = i;
    *local_c8 = *pcStack_120;
    local_a8 = i;
    local_b8 = "copy of dead GC object";
    local_d0 = pcStack_120;
    local_b0 = local_c8;
  }
  local_145 = 0;
  if (((int)(pcStack_120->field_4).it >> 0xf == -9) &&
     (local_145 = 0, *(char *)((pcStack_120->u64 & 0x7fffffffffff) + 10) == '\x12')) {
    local_145 = *(long *)(*(long *)(i + 0x10) + 0x2c0) != 0 ^ 0xff;
  }
  o._4_4_ = (uint)(local_145 & 1);
  nargs = 0;
  do {
    if ((long)tv <= nargs) {
      putchar(10);
      return 0;
    }
    str = (char *)(*(long *)(i + 0x20) + nargs * 8);
    if (o._4_4_ == 0) {
LAB_00191349:
      local_e0 = (undefined8 *)(*(long *)(i + 0x28) + 8);
      local_d8 = i;
      local_e8 = str;
      *local_e0 = *(undefined8 *)str;
      local_90 = i;
      local_a0 = "copy of dead GC object";
      local_f8 = *(uint64_t **)(i + 0x28);
      L_local = (lua_State *)(*(long *)(i + 0x28) + -8);
      local_f0 = i;
      *local_f8 = (L_local->nextgc).gcptr64;
      local_78 = i;
      local_88 = "copy of dead GC object";
      *(long *)(i + 0x28) = *(long *)(i + 0x28) + 0x10;
      local_98 = local_e0;
      local_80 = local_f8;
      lua_call((lua_State *)i,1,1);
      size = (size_t)lua_tolstring((lua_State *)i,-1,&stack0xfffffffffffffec0);
      if ((char *)size == (char *)0x0) {
        lj_err_caller((lua_State *)i,LJ_ERR_PRTOSTR);
      }
      *(long *)(i + 0x28) = *(long *)(i + 0x28) + -8;
    }
    else {
      size = (size_t)lj_strfmt_wstrnum((lua_State *)i,(cTValue *)str,&local_144);
      if ((char *)size == (char *)0x0) goto LAB_00191349;
      uStack_140 = (ulong)local_144;
    }
    if (nargs != 0) {
      putchar(9);
    }
    fwrite((void *)size,1,uStack_140,_stdout);
    nargs = nargs + 1;
  } while( true );
}

Assistant:

LJLIB_CF(print)
{
  ptrdiff_t i, nargs = L->top - L->base;
  cTValue *tv = lj_tab_getstr(tabref(L->env), strV(lj_lib_upvalue(L, 1)));
  int shortcut;
  if (tv && !tvisnil(tv)) {
    copyTV(L, L->top++, tv);
  } else {
    setstrV(L, L->top++, strV(lj_lib_upvalue(L, 1)));
    lua_gettable(L, LUA_GLOBALSINDEX);
    tv = L->top-1;
  }
  shortcut = (tvisfunc(tv) && funcV(tv)->c.ffid == FF_tostring) &&
	     !gcrefu(basemt_it(G(L), LJ_TNUMX));
  for (i = 0; i < nargs; i++) {
    cTValue *o = &L->base[i];
    const char *str;
    size_t size;
    MSize len;
    if (shortcut && (str = lj_strfmt_wstrnum(L, o, &len)) != NULL) {
      size = len;
    } else {
      copyTV(L, L->top+1, o);
      copyTV(L, L->top, L->top-1);
      L->top += 2;
      lua_call(L, 1, 1);
      str = lua_tolstring(L, -1, &size);
      if (!str)
	lj_err_caller(L, LJ_ERR_PRTOSTR);
      L->top--;
    }
    if (i)
      putchar('\t');
    fwrite(str, 1, size, stdout);
  }
  putchar('\n');
  return 0;
}